

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

size_t __thiscall
google::protobuf::internal::ExtensionSet::Extension::SpaceUsedExcludingSelfLong(Extension *this)

{
  int iVar1;
  size_t sVar2;
  Message *pMVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar4;
  bool bVar5;
  
  iVar1 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this->type * 4);
  if (this->is_repeated != true) {
    if (iVar1 == 10) {
      if ((this->field_0xa & 0x10) == 0) {
        pMVar3 = down_cast<google::protobuf::Message*,google::protobuf::MessageLite>
                           ((this->field_0).message_value);
        iVar1 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[0x14])(pMVar3);
        return CONCAT44(extraout_var,iVar1);
      }
      iVar1 = (*((this->field_0).message_value)->_vptr_MessageLite[0xb])();
      return CONCAT44(extraout_var_00,iVar1);
    }
    if (iVar1 == 9) {
      sVar2 = StringSpaceUsedExcludingSelfLong((this->field_0).string_value);
      return sVar2 + 0x20;
    }
LAB_003107d5:
    return 0;
  }
  switch(iVar1) {
  case 1:
  case 3:
  case 6:
  case 8:
    bVar5 = ((this->field_0).repeated_int32_value)->rep_ == (Rep *)0x0;
    sVar2 = (long)((this->field_0).repeated_int32_value)->total_size_ * 4 + 0x18;
    break;
  case 2:
  case 4:
  case 5:
    bVar5 = ((this->field_0).repeated_int32_value)->rep_ == (Rep *)0x0;
    sVar2 = (long)((this->field_0).repeated_int32_value)->total_size_ * 8 + 0x18;
    break;
  case 7:
    sVar2 = (long)((this->field_0).repeated_int32_value)->total_size_ + 0x18;
    bVar5 = ((this->field_0).repeated_int32_value)->rep_ == (Rep *)0x0;
    break;
  case 9:
    sVar2 = RepeatedPtrFieldBase::
            SpaceUsedExcludingSelfLong<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(this->field_0).string_value);
    goto LAB_003107df;
  case 10:
    sVar2 = RepeatedPtrFieldBase::
            SpaceUsedExcludingSelfLong<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                      ((RepeatedPtrFieldBase *)(this->field_0).string_value);
LAB_003107df:
    return sVar2 + 0x18;
  default:
    goto LAB_003107d5;
  }
  sVar4 = 0x10;
  if (!bVar5) {
    sVar4 = sVar2;
  }
  return sVar4;
}

Assistant:

size_t ExtensionSet::Extension::SpaceUsedExcludingSelfLong() const {
  size_t total_size = 0;
  if (is_repeated) {
    switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                     \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:                                  \
    total_size += sizeof(*repeated_##LOWERCASE##_value) +                     \
                  repeated_##LOWERCASE##_value->SpaceUsedExcludingSelfLong(); \
    break

      HANDLE_TYPE(  INT32,   int32);
      HANDLE_TYPE(  INT64,   int64);
      HANDLE_TYPE( UINT32,  uint32);
      HANDLE_TYPE( UINT64,  uint64);
      HANDLE_TYPE(  FLOAT,   float);
      HANDLE_TYPE( DOUBLE,  double);
      HANDLE_TYPE(   BOOL,    bool);
      HANDLE_TYPE(   ENUM,    enum);
      HANDLE_TYPE( STRING,  string);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_MESSAGE:
        // repeated_message_value is actually a RepeatedPtrField<MessageLite>,
        // but MessageLite has no SpaceUsedLong(), so we must directly call
        // RepeatedPtrFieldBase::SpaceUsedExcludingSelfLong() with a different
        // type handler.
        total_size +=
            sizeof(*repeated_message_value) +
            RepeatedMessage_SpaceUsedExcludingSelfLong(repeated_message_value);
        break;
    }
  } else {
    switch (cpp_type(type)) {
      case FieldDescriptor::CPPTYPE_STRING:
        total_size += sizeof(*string_value) +
                      StringSpaceUsedExcludingSelfLong(*string_value);
        break;
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (is_lazy) {
          total_size += lazymessage_value->SpaceUsedLong();
        } else {
          total_size += down_cast<Message*>(message_value)->SpaceUsedLong();
        }
        break;
      default:
        // No extra storage costs for primitive types.
        break;
    }
  }
  return total_size;
}